

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_go.cpp
# Opt level: O3

string * __thiscall
flatbuffers::go::GoGenerator::GenGetter_abi_cxx11_
          (string *__return_storage_ptr__,GoGenerator *this,Type *type)

{
  BaseType BVar1;
  long lVar2;
  long *plVar3;
  size_type *psVar4;
  char *pcVar5;
  char *pcVar6;
  allocator<char> local_61;
  Type local_60;
  long *local_40 [2];
  long local_30 [2];
  
  BVar1 = type->base_type;
  if ((ulong)BVar1 == 0x10) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar6 = "rcv._tab.Union";
    pcVar5 = "";
  }
  else {
    if (BVar1 == BASE_TYPE_VECTOR) {
      local_60.base_type = type->element;
      local_60.fixed_length = type->fixed_length;
      local_60.element = BASE_TYPE_NONE;
      local_60.struct_def = type->struct_def;
      local_60.enum_def = type->enum_def;
      GenGetter_abi_cxx11_(__return_storage_ptr__,this,&local_60);
      return __return_storage_ptr__;
    }
    if (BVar1 != BASE_TYPE_STRING) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_40,
                 *(char **)(GenTypeBasic[abi:cxx11](flatbuffers::Type_const&)::ctypename +
                           (ulong)BVar1 * 8),&local_61);
      (*(this->namer_).super_Namer._vptr_Namer[0x14])
                (&local_60,&this->namer_,(string *)local_40,
                 (ulong)(this->namer_).super_Namer.config_.functions);
      plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_60,0,(char *)0x0,0x36c209);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      psVar4 = (size_type *)(plVar3 + 2);
      if ((size_type *)*plVar3 == psVar4) {
        lVar2 = plVar3[3];
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
        *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar3;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
      }
      __return_storage_ptr__->_M_string_length = plVar3[1];
      *plVar3 = (long)psVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      if ((EnumDef **)CONCAT44(local_60.element,local_60.base_type) != &local_60.enum_def) {
        operator_delete((undefined1 *)CONCAT44(local_60.element,local_60.base_type),
                        (ulong)((long)&((local_60.enum_def)->super_Definition).name._M_dataplus._M_p
                               + 1));
      }
      if (local_40[0] == local_30) {
        return __return_storage_ptr__;
      }
      operator_delete(local_40[0],local_30[0] + 1);
      return __return_storage_ptr__;
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar6 = "rcv._tab.ByteVector";
    pcVar5 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar6,pcVar5);
  return __return_storage_ptr__;
}

Assistant:

std::string GenGetter(const Type &type) {
    switch (type.base_type) {
      case BASE_TYPE_STRING: return "rcv._tab.ByteVector";
      case BASE_TYPE_UNION: return "rcv._tab.Union";
      case BASE_TYPE_VECTOR: return GenGetter(type.VectorType());
      default: return "rcv._tab.Get" + namer_.Function(GenTypeBasic(type));
    }
  }